

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.c
# Opt level: O2

int countVariables(Node *node)

{
  int count;
  
  count = 0;
  for (; node != (Node *)0x0; node = (node->rule).next) {
    count = count + 1;
  }
  return count;
}

Assistant:

static int countVariables(Node *node)
{
  int count= 0;
  while (node)
    {
      ++count;
      node= node->variable.next;
    }
  return count;
}